

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# harvest.cc
# Opt level: O2

int sptk::world::anon_unknown_5::GetBoundaryList(double *f0,int f0_length,int *boundary_list)

{
  undefined4 *puVar1;
  int i;
  long lVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  
  lVar7 = (long)f0_length;
  uVar5 = 0;
  uVar4 = 0xffffffffffffffff;
  if (-1 < f0_length) {
    uVar4 = lVar7 * 4;
  }
  uVar6 = 0;
  if (0 < f0_length) {
    uVar6 = (ulong)(uint)f0_length;
  }
  puVar1 = (undefined4 *)operator_new__(uVar4);
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    puVar1[uVar5] = (uint)(0.0 < f0[uVar5]);
  }
  puVar1[lVar7 + -1] = 0;
  *puVar1 = 0;
  iVar3 = 0;
  for (lVar2 = 1; lVar2 < lVar7; lVar2 = lVar2 + 1) {
    if (puVar1[lVar2] != puVar1[lVar2 + -1]) {
      boundary_list[iVar3] = (int)lVar2 - iVar3 % 2;
      iVar3 = iVar3 + 1;
    }
  }
  operator_delete__(puVar1);
  return iVar3;
}

Assistant:

static int GetBoundaryList(const double *f0, int f0_length,
    int *boundary_list) {
  int number_of_boundaries = 0;
  int *vuv = new int[f0_length];
  for (int i = 0; i < f0_length; ++i)
    vuv[i] = f0[i] > 0 ? 1 : 0;
  vuv[0] = vuv[f0_length - 1] = 0;

  for (int i = 1; i < f0_length; ++i)
    if (vuv[i] - vuv[i - 1] != 0) {
      boundary_list[number_of_boundaries] = i - number_of_boundaries % 2;
      number_of_boundaries++;
    }

  delete[] vuv;
  return number_of_boundaries;
}